

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O3

Sequence * __thiscall
Sequence::operator*(Sequence *__return_storage_ptr__,Sequence *this,Sequence *t_seq)

{
  uint uVar1;
  uint uVar2;
  _Map_pointer ppiVar3;
  _Map_pointer ppiVar4;
  _Elt_pointer piVar5;
  ulong uVar6;
  int iVar7;
  uint *puVar8;
  ulong uVar9;
  size_type __n;
  int iVar10;
  int iVar11;
  long lVar12;
  
  ppiVar3 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  Sequence(__return_storage_ptr__,
           (int)((ulong)((long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                               super__Deque_impl_data._M_start._M_last -
                        (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_start._M_cur) >> 2) +
           (int)((ulong)((long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_cur -
                        (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_first) >> 2) +
           ((((uint)((int)ppiVar3 -
                    *(int *)&(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                             super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (uint)(ppiVar3 == (_Map_pointer)0x0)) * 0x80);
  ppiVar3 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  ppiVar4 = (t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar7 = (int)(t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
  iVar11 = (int)((ulong)((long)(t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                               super__Deque_impl_data._M_start._M_last -
                        (long)(t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_start._M_cur) >> 2);
  iVar10 = (int)((ulong)((long)(t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_cur -
                        (long)(t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_first) >> 2);
  if (((int)((ulong)((long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                           super__Deque_impl_data._M_start._M_last -
                    (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur) >> 2) +
       (int)((ulong)((long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_cur -
                    (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_first) >> 2) +
       ((((uint)((int)ppiVar3 -
                *(int *)&(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
       (uint)(ppiVar3 == (_Map_pointer)0x0)) * 0x80 ==
       ((((uint)((int)ppiVar4 - iVar7) >> 3) - 1) + (uint)(ppiVar4 == (_Map_pointer)0x0)) * 0x80 +
       iVar11 + iVar10) &&
     (0 < (int)(iVar11 + iVar10 +
               ((((uint)((int)ppiVar4 - iVar7) >> 3) - 1) + (uint)(ppiVar4 == (_Map_pointer)0x0)) *
               0x80))) {
    lVar12 = 0;
    __n = 0;
    do {
      piVar5 = (this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      uVar6 = ((long)piVar5 -
               (long)(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_start._M_first >> 2) + __n;
      if ((long)uVar6 < 0) {
        uVar9 = (long)uVar6 >> 7;
LAB_001073fb:
        puVar8 = (uint *)((this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_start._M_node[uVar9] + uVar6 + uVar9 * -0x80);
      }
      else {
        if (0x7f < uVar6) {
          uVar9 = uVar6 >> 7;
          goto LAB_001073fb;
        }
        puVar8 = (uint *)((long)piVar5 + lVar12);
      }
      uVar1 = *puVar8;
      puVar8 = (uint *)std::deque<int,_std::allocator<int>_>::at(&t_seq->m_bits,__n);
      uVar2 = *puVar8;
      puVar8 = (uint *)std::deque<int,_std::allocator<int>_>::at
                                 (&__return_storage_ptr__->m_bits,__n);
      *puVar8 = uVar2 ^ uVar1;
      __n = __n + 1;
      ppiVar3 = (t_seq->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      lVar12 = lVar12 + 4;
    } while ((long)__n <
             (long)(int)((int)((ulong)((long)(t_seq->m_bits).
                                             super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                             super__Deque_impl_data._M_start._M_last -
                                      (long)(t_seq->m_bits).
                                            super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                            super__Deque_impl_data._M_start._M_cur) >> 2) +
                         (int)((ulong)((long)(t_seq->m_bits).
                                             super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                             super__Deque_impl_data._M_finish._M_cur -
                                      (long)(t_seq->m_bits).
                                            super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                            super__Deque_impl_data._M_finish._M_first) >> 2) +
                        ((((uint)((int)ppiVar3 -
                                 *(int *)&(t_seq->m_bits).
                                          super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                          super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                        (uint)(ppiVar3 == (_Map_pointer)0x0)) * 0x80));
  }
  return __return_storage_ptr__;
}

Assistant:

Sequence Sequence::operator*(Sequence t_seq) {
    Sequence res(size());
    if (size() != t_seq.size()) {
        return res;
    }
    for (auto i = 0; i < t_seq.size(); ++i) {
        res[i] = m_bits[i] ^ t_seq[i];
    }
    return res;
}